

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doubly_linked_list.cpp
# Opt level: O3

void __thiscall si9ma::DoublyLinkedList::push_back(DoublyLinkedList *this,int val)

{
  int iVar1;
  DoublyNode *this_00;
  DoublyNode *pDVar2;
  
  this_00 = (DoublyNode *)operator_new(0x18);
  DoublyNode::DoublyNode(this_00,val);
  iVar1 = this->size;
  if (iVar1 == 0) {
    this->tail = this_00;
    this->head = this_00;
    this_00->next = (DoublyNode *)0x0;
    pDVar2 = (DoublyNode *)0x0;
  }
  else {
    pDVar2 = this->tail;
    this_00->next = (DoublyNode *)0x0;
    pDVar2->next = this_00;
    this->tail = this_00;
  }
  this_00->prev = pDVar2;
  this->size = iVar1 + 1;
  return;
}

Assistant:

void DoublyLinkedList::push_back(int val) {
        auto *new_node = new DoublyNode(val);
        if (is_empty()){
            head = tail = new_node;
            new_node->next = new_node->prev = nullptr;
        } else{
            new_node->prev = tail;
            new_node->next = nullptr;
            tail->next = new_node;
            tail = new_node;
        }

        size ++;
    }